

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v2.cpp
# Opt level: O1

void __thiscall intel_acbp_v2_t::public_key_t::_read(public_key_t *this)

{
  uint8_t uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  string local_30;
  
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_version = uVar1;
  uVar2 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_size_bits = uVar2;
  uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_exponent = uVar3;
  kaitai::kstream::read_bytes_abi_cxx11_
            (&local_30,(this->super_kstruct).m__io,(ulong)(this->m_size_bits >> 3));
  std::__cxx11::string::operator=((string *)&this->m_modulus,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void intel_acbp_v2_t::public_key_t::_read() {
    m_version = m__io->read_u1();
    m_size_bits = m__io->read_u2le();
    m_exponent = m__io->read_u4le();
    m_modulus = m__io->read_bytes((size_bits() / 8));
}